

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DirWatcherGeneric.cpp
# Opt level: O2

void __thiscall efsw::DirWatcherGeneric::resetDirectory(DirWatcherGeneric *this,string *directory)

{
  char cVar1;
  bool bVar2;
  char cVar3;
  char *pcVar4;
  DirWatcherGeneric *pDVar5;
  string parentPath;
  string dir;
  string sStack_98;
  string local_78 [32];
  string local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  std::__cxx11::string::string(local_78,(string *)directory);
  bVar2 = std::operator!=(&(this->Watch->super_Watcher).Directory,directory);
  if (!bVar2) goto LAB_0010e6b1;
  if (directory->_M_string_length == 0) {
    pDVar5 = this->Parent;
    if (pDVar5 == (DirWatcherGeneric *)0x0) goto LAB_0010e6b1;
  }
  else {
    pcVar4 = (char *)std::__cxx11::string::at((ulong)directory);
    cVar1 = *pcVar4;
    cVar3 = FileSystem::getOSSlash();
    if (cVar1 == cVar3) goto LAB_0010e6b1;
    pcVar4 = (char *)std::__cxx11::string::at((ulong)directory);
    cVar1 = *pcVar4;
    cVar3 = FileSystem::getOSSlash();
    pDVar5 = this->Parent;
    if (pDVar5 == (DirWatcherGeneric *)0x0 || cVar1 == cVar3) goto LAB_0010e6b1;
  }
  std::__cxx11::string::string((string *)&sStack_98,(string *)&pDVar5->DirSnap);
  FileSystem::dirAddSlashAtEnd(&sStack_98);
  FileSystem::dirAddSlashAtEnd(directory);
  std::operator+(&local_38,&sStack_98,directory);
  std::__cxx11::string::operator=(local_78,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&sStack_98);
LAB_0010e6b1:
  std::__cxx11::string::string((string *)&local_58,local_78);
  DirectorySnapshot::setDirectoryInfo(&this->DirSnap,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string(local_78);
  return;
}

Assistant:

void DirWatcherGeneric::resetDirectory( std::string directory ) {
	std::string dir( directory );

	/// Is this a recursive watch?
	if ( Watch->Directory != directory ) {
		if ( !( directory.size() &&
				( directory.at( 0 ) == FileSystem::getOSSlash() ||
				  directory.at( directory.size() - 1 ) == FileSystem::getOSSlash() ) ) ) {
			/// Get the real directory
			if ( NULL != Parent ) {
				std::string parentPath( Parent->DirSnap.DirectoryInfo.Filepath );
				FileSystem::dirAddSlashAtEnd( parentPath );
				FileSystem::dirAddSlashAtEnd( directory );

				dir = parentPath + directory;
			} else {
				efDEBUG( "resetDirectory(): Parent is NULL. Fatal error." );
			}
		}
	}

	DirSnap.setDirectoryInfo( dir );
}